

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O3

void __thiscall correctness_shr_signed_Test::TestBody(correctness_shr_signed_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  big_integer a;
  AssertHelper local_c8;
  Message local_c0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  undefined1 local_b0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8 [6];
  big_integer local_78;
  big_integer local_40;
  
  big_integer::big_integer(&local_78,-0x4d2);
  big_integer::big_integer(&local_40,&local_78);
  operator>>((big_integer *)local_b0,&local_40,3);
  local_c8.data_._0_4_ = 0xffffff65;
  testing::internal::CmpHelperEQ<big_integer,int>
            ((internal *)&local_c0,"a >> 3","-155",(big_integer *)local_b0,(int *)&local_c8);
  big_integer::~big_integer((big_integer *)local_b0);
  big_integer::~big_integer(&local_40);
  if (local_c0.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (local_b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x1b9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (CONCAT71(local_b0._1_7_,local_b0[0]) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_b0._1_7_,local_b0[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_b0._1_7_,local_b0[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  big_integer::operator>>=(&local_78,3);
  local_c0.ss_.ptr_._0_4_ = 0xffffff65;
  testing::internal::CmpHelperEQ<big_integer,int>
            ((internal *)local_b0,"a","-155",&local_78,(int *)&local_c0);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message(&local_c0);
    if (local_a8[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_a8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x1bc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (CONCAT44(local_c0.ss_.ptr_._4_4_,local_c0.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_c0.ss_.ptr_._4_4_,local_c0.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c0.ss_.ptr_._4_4_,local_c0.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  big_integer::~big_integer(&local_78);
  return;
}

Assistant:

TEST(correctness, shr_signed)
{
    big_integer a = -1234;

    EXPECT_EQ(a >> 3, -155);

    a >>= 3;
    EXPECT_EQ(a, -155);
}